

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::LazyDescriptor::Once(LazyDescriptor *this,ServiceDescriptor *service)

{
  __int_type_conflict1 _Var1;
  once_flag *w;
  once_flag *poVar2;
  DescriptorPool *this_00;
  uint32_t uVar3;
  size_t sVar4;
  Symbol SVar5;
  Symbol SVar6;
  bool bVar7;
  string_view name;
  LogMessageFatal LStack_38;
  
  w = this->once_;
  if ((w != (once_flag *)0x0) && ((w->control_).super___atomic_base<unsigned_int>._M_i != 0xdd)) {
    _Var1 = (w->control_).super___atomic_base<unsigned_int>._M_i;
    if ((_Var1 != 0) && (((_Var1 != 0xdd && (_Var1 != 0x5a308d2)) && (_Var1 != 0x65c2937b)))) {
      absl::lts_20250127::raw_log_internal::RawLog
                (kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/call_once.h"
                    ,0xa4,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:10502:29), Args = <>]"
                   );
    }
    LOCK();
    bVar7 = (w->control_).super___atomic_base<unsigned_int>._M_i == 0;
    if (bVar7) {
      (w->control_).super___atomic_base<unsigned_int>._M_i = 0x65c2937b;
    }
    UNLOCK();
    if ((bVar7) ||
       (uVar3 = absl::lts_20250127::base_internal::SpinLockWait
                          (&w->control_,3,
                           (SpinLockWaitTransition *)
                           absl::lts_20250127::base_internal::
                           CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::$_0>(std::atomic<unsigned_int>*,absl::lts_20250127::base_internal::SchedulingMode,google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::$_0&&)
                           ::trans,SCHEDULE_COOPERATIVE_AND_KERNEL), uVar3 == 0)) {
      if (service->file_->finished_building_ == false) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x2908,"file->finished_building_");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
      }
      poVar2 = this->once_;
      this_00 = service->file_->pool_;
      sVar4 = strlen((char *)(poVar2 + 1));
      name._M_str = (char *)(poVar2 + 1);
      name._M_len = sVar4;
      SVar5 = DescriptorPool::CrossLinkOnDemandHelper(this_00,name,false);
      SVar6.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
      if ((SVar5.ptr_)->symbol_type_ == '\x01') {
        SVar6 = SVar5;
      }
      this->descriptor_ = (Descriptor *)SVar6.ptr_;
      LOCK();
      _Var1 = (w->control_).super___atomic_base<unsigned_int>._M_i;
      (w->control_).super___atomic_base<unsigned_int>._M_i = 0xdd;
      UNLOCK();
      if (_Var1 == 0x5a308d2) {
        AbslInternalSpinLockWake_lts_20250127(&w->control_,true);
        return;
      }
    }
  }
  return;
}

Assistant:

void LazyDescriptor::Once(const ServiceDescriptor* service) {
  if (once_) {
    absl::call_once(*once_, [&] {
      auto* file = service->file();
      ABSL_CHECK(file->finished_building_);
      const char* lazy_name = reinterpret_cast<const char*>(once_ + 1);
      descriptor_ =
          file->pool_->CrossLinkOnDemandHelper(lazy_name, false).descriptor();
    });
  }
}